

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEVPMacAlgorithm.cpp
# Opt level: O0

bool __thiscall
OSSLEVPMacAlgorithm::verifyUpdate(OSSLEVPMacAlgorithm *this,ByteString *originalData)

{
  HMAC_CTX *ctx;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  uchar *data;
  ByteString *in_RSI;
  MacAlgorithm *in_RDI;
  ByteString dummy;
  ByteString *in_stack_ffffffffffffff88;
  ByteString local_40;
  byte local_1;
  
  bVar1 = MacAlgorithm::verifyUpdate(in_RDI,in_RSI);
  if (bVar1) {
    sVar3 = ByteString::size((ByteString *)0x1ba40a);
    if (sVar3 == 0) {
      local_1 = 1;
    }
    else {
      ctx = (HMAC_CTX *)in_RDI[1]._vptr_MacAlgorithm;
      data = ByteString::const_byte_str(in_stack_ffffffffffffff88);
      sVar3 = ByteString::size((ByteString *)0x1ba441);
      iVar2 = HMAC_Update(ctx,data,sVar3);
      if (iVar2 == 0) {
        softHSMLog(3,"verifyUpdate",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPMacAlgorithm.cpp"
                   ,0xb5,"HMAC_Update failed");
        HMAC_CTX_free(in_RDI[1]._vptr_MacAlgorithm);
        in_RDI[1]._vptr_MacAlgorithm = (_func_int **)0x0;
        ByteString::ByteString((ByteString *)0x1ba4ac);
        MacAlgorithm::verifyFinal(in_RDI,&local_40);
        local_1 = 0;
        ByteString::~ByteString((ByteString *)0x1ba4cc);
      }
      else {
        local_1 = 1;
      }
    }
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool OSSLEVPMacAlgorithm::verifyUpdate(const ByteString& originalData)
{
	if (!MacAlgorithm::verifyUpdate(originalData))
	{
		return false;
	}

	// The GOST implementation in OpenSSL will segfault if we update with zero length.
	if (originalData.size() == 0) return true;

	if (!HMAC_Update(curCTX, originalData.const_byte_str(), originalData.size()))
	{
		ERROR_MSG("HMAC_Update failed");

		HMAC_CTX_free(curCTX);
		curCTX = NULL;

		ByteString dummy;
		MacAlgorithm::verifyFinal(dummy);

		return false;
	}

	return true;
}